

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O1

void testRgba(string *tempDir)

{
  float *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  short sVar3;
  pointer pcVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  _Alloc_hider _Var8;
  char cVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  unsigned_short uVar13;
  ushort uVar14;
  uint uVar15;
  int iVar16;
  long *plVar17;
  Rgba *pRVar18;
  ulong uVar19;
  Compression *pCVar20;
  Rgba *base;
  Box2i *pBVar21;
  half *phVar22;
  int iVar23;
  half *phVar24;
  int iVar25;
  int x_3;
  uint uVar26;
  uint uVar27;
  RgbaChannels channels;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined8 in_R9;
  int x;
  long lVar31;
  Array2D<Imf_2_5::Rgba> *p1_00;
  uint uVar32;
  long lVar33;
  int y;
  uint uVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  Compression in_stack_fffffffffffffe78;
  uint local_180;
  ulong local_178;
  long local_170;
  Rgba *local_168;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_e8;
  string fileName_1;
  RgbaOutputFile out;
  uif x_2;
  uif x_1;
  Rgba *local_68;
  Array2D<Imf_2_5::Rgba> p1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the RGBA image interface",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  uVar15 = (uint)_endl<char,std::char_traits<char>>;
  if (_endl<char,std::char_traits<char>> == 0) {
    uVar15 = half::convert(0x40000000);
    uVar26 = half::convert(0x40400000);
  }
  else {
    uVar26 = uVar15 + 0x200;
  }
  uVar12 = _DAT_00442142;
  uVar32 = (uint)_DAT_00442142;
  uVar10 = _DAT_00442142;
  if (_DAT_00442142 == 0) {
    uVar10 = half::convert(0x40800000);
  }
  uVar11 = _DAT_0044213e;
  if (_DAT_0044213e == 0) {
    uVar11 = half::convert(0x3f800000);
  }
  fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar15 & 0xffff) * 4);
  if ((fVar36 == 2.0) && (!NAN(fVar36))) {
    fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar26 & 0xffff) * 4);
    if ((fVar36 == 3.0) && (!NAN(fVar36))) {
      fVar36 = *(float *)((long)&half::_toFloat + (ulong)uVar10 * 4);
      if ((fVar36 == 4.0) && (!NAN(fVar36))) {
        fVar36 = *(float *)((long)&half::_toFloat + (ulong)uVar11 * 4);
        if ((fVar36 == 1.0) && (!NAN(fVar36))) {
          if (uVar12 == 0) {
            uVar27 = half::convert(0x40a00000);
            uVar34 = half::convert(0x40c00000);
            uVar32 = half::convert(0x40e00000);
          }
          else {
            uVar27 = uVar12 + 0x100;
            uVar34 = uVar12 + 0x200;
            uVar32 = uVar32 + 0x300;
          }
          fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar27 & 0xffff) * 4);
          if (((((fVar36 != 5.0) || (NAN(fVar36))) ||
               (fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar34 & 0xffff) * 4),
               fVar36 != 6.0)) ||
              ((NAN(fVar36) ||
               (fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar32 & 0xffff) * 4),
               fVar36 != 7.0)))) ||
             ((NAN(fVar36) || (((float)half::_toFloat != 0.0 || (NAN((float)half::_toFloat))))))) {
            __assert_fail("y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x4a,"void (anonymous namespace)::rgbaMethods()");
          }
          fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar15 & 0xffff) * 4);
          if ((((fVar36 != 2.0) || (NAN(fVar36))) ||
              (fVar36 = *(float *)((long)&half::_toFloat + (ulong)(uVar26 & 0xffff) * 4),
              fVar36 != 3.0)) ||
             (((NAN(fVar36) ||
               (fVar36 = *(float *)((long)&half::_toFloat + (ulong)uVar10 * 4), fVar36 != 4.0)) ||
              ((NAN(fVar36) ||
               ((fVar36 = *(float *)((long)&half::_toFloat + (ulong)uVar11 * 4), fVar36 != 1.0 ||
                (NAN(fVar36))))))))) {
            __assert_fail("z.r == 2.f && z.g == 3.f && z.b == 4.f && z.a == 1.f",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x4f,"void (anonymous namespace)::rgbaMethods()");
          }
          p1._sizeX = 0x77;
          p1._sizeY = 0xed;
          p1._data = (Rgba *)operator_new__(0x37158);
          lVar33 = 0;
          lVar35 = 0;
          do {
            dVar5 = (double)(int)lVar35;
            lVar31 = 0;
            do {
              pRVar18 = p1._data;
              lVar28 = p1._sizeY;
              dVar6 = (double)(int)lVar31;
              dVar7 = sin(dVar6 * 0.1 + dVar5 * 0.1);
              fVar36 = (float)(dVar7 * 0.5 + 0.5);
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                if (sVar3 == 0) {
                  uVar13 = half::convert((int)fVar36);
                }
                else {
                  uVar13 = sVar3 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                           (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                uVar13 = (unsigned_short)((uint)fVar36 >> 0x10);
              }
              lVar28 = lVar28 * lVar33;
              *(unsigned_short *)((long)&pRVar18[lVar31].r._h + lVar28) = uVar13;
              dVar7 = sin(dVar6 * 0.1 + dVar5 * 0.2);
              fVar36 = (float)(dVar7 * 0.5 + 0.5);
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                if (sVar3 == 0) {
                  uVar13 = half::convert((int)fVar36);
                }
                else {
                  uVar13 = sVar3 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                           (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                uVar13 = (unsigned_short)((uint)fVar36 >> 0x10);
              }
              *(unsigned_short *)((long)&pRVar18[lVar31].g._h + lVar28) = uVar13;
              dVar6 = sin(dVar6 * 0.1 + dVar5 * 0.3);
              fVar36 = (float)(dVar6 * 0.5 + 0.5);
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                if (sVar3 == 0) {
                  uVar12 = half::convert((int)fVar36);
                }
                else {
                  uVar12 = sVar3 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                           (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                uVar12 = (ushort)((uint)fVar36 >> 0x10);
              }
              *(ushort *)((long)&pRVar18[lVar31].b._h + lVar28) = uVar12;
              fVar36 = (*(float *)((long)&half::_toFloat +
                                  (ulong)*(unsigned_short *)((long)&pRVar18[lVar31].r._h + lVar28) *
                                  4) + *(float *)((long)&half::_toFloat + (ulong)uVar12 * 4) +
                       *(float *)((long)&half::_toFloat +
                                 (ulong)*(unsigned_short *)((long)&pRVar18[lVar31].g._h + lVar28) *
                                 4)) / 3.0;
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                if (sVar3 == 0) {
                  uVar13 = half::convert((int)fVar36);
                }
                else {
                  uVar13 = sVar3 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                           (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                uVar13 = (unsigned_short)((uint)fVar36 >> 0x10);
              }
              *(unsigned_short *)((long)&pRVar18[lVar31].a._h + lVar28) = uVar13;
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0xed);
            lVar35 = lVar35 + 1;
            lVar33 = lVar33 + 8;
          } while (lVar35 != 0x77);
          IlmThread_2_5::supportsThreads();
          uVar12 = _DAT_0044233e;
          paVar2 = &__str.field_2;
          cVar9 = IlmThread_2_5::supportsThreads();
          if (cVar9 != '\0') {
            Imf_2_5::setGlobalThreadCount(0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
            iVar16 = Imf_2_5::globalThreadCount();
            plVar17 = (long *)std::ostream::operator<<(&std::cout,iVar16);
            std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
            std::ostream::put((char)plVar17);
            std::ostream::flush();
          }
          p1_00 = (Array2D<Imf_2_5::Rgba> *)0x0;
          do {
            channels = 0;
            do {
              pcVar4 = (tempDir->_M_dataplus)._M_p;
              __str._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,pcVar4,pcVar4 + tempDir->_M_string_length);
              std::__cxx11::string::append((char *)&__str);
              iVar25 = (int)p1_00;
              iVar16 = (int)&p1;
              anon_unknown.dwarf_27f20c::writeReadRGBA
                        (__str._M_dataplus._M_p,iVar16,0xf,p1_00,channels,(LineOrder)in_R9,
                         in_stack_fffffffffffffe78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != paVar2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pcVar4 = (tempDir->_M_dataplus)._M_p;
              __str._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,pcVar4,pcVar4 + tempDir->_M_string_length);
              std::__cxx11::string::append((char *)&__str);
              anon_unknown.dwarf_27f20c::writeReadRGBA
                        (__str._M_dataplus._M_p,iVar16,7,p1_00,channels,(LineOrder)in_R9,
                         in_stack_fffffffffffffe78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != paVar2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pcVar4 = (tempDir->_M_dataplus)._M_p;
              __str._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,pcVar4,pcVar4 + tempDir->_M_string_length);
              std::__cxx11::string::append((char *)&__str);
              anon_unknown.dwarf_27f20c::writeReadRGBA
                        (__str._M_dataplus._M_p,iVar16,8,p1_00,channels,(LineOrder)in_R9,
                         in_stack_fffffffffffffe78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != paVar2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              pcVar4 = (tempDir->_M_dataplus)._M_p;
              __str._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,pcVar4,pcVar4 + tempDir->_M_string_length);
              std::__cxx11::string::append((char *)&__str);
              anon_unknown.dwarf_27f20c::writeReadRGBA
                        (__str._M_dataplus._M_p,iVar16,5,p1_00,channels,(LineOrder)in_R9,
                         in_stack_fffffffffffffe78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != paVar2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              channels = channels + WRITE_R;
            } while (channels != (WRITE_A|WRITE_G));
            p1_00 = (Array2D<Imf_2_5::Rgba> *)(ulong)(iVar25 + 1);
          } while (iVar25 == 0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nfile with missing and broken scan lines",0x28);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          pcVar4 = (tempDir->_M_dataplus)._M_p;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fileName,pcVar4,pcVar4 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)&fileName);
          pRVar18 = (Rgba *)operator_new__(960000);
          uVar30 = 0;
          local_68 = pRVar18;
          do {
            uVar19 = uVar30 & 0xffffffff;
            iVar25 = (int)(uVar19 / 0x17) + (int)(uVar19 / 0x17) * -0x18 + (int)uVar30;
            fVar36 = (float)iVar25;
            iVar16 = (int)uVar30 + (int)(uVar19 / 0x1d) * -2 + (int)(uVar19 / 0x1d) * -0x1b;
            fVar37 = (float)iVar16;
            uVar19 = 0;
            do {
              uVar29 = uVar19 & 0xffffffff;
              iVar23 = (int)uVar19 + (int)(uVar29 / 5) * -5;
              fVar38 = (float)iVar23;
              if (iVar23 == 0) {
                local_178 = (ulong)((uint)fVar38 >> 0x10);
              }
              else {
                uVar10 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar38 >> 0x17) * 2);
                if (uVar10 == 0) {
                  uVar15 = half::convert((int)fVar38);
                  local_178 = (ulong)uVar15;
                }
                else {
                  local_178 = (ulong)((uint)uVar10 +
                                     (((uint)fVar38 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar38 >> 0xd & 1) != 0) >> 0xd));
                }
              }
              iVar23 = (int)uVar19 -
                       (((uint)(uVar29 * 0xf0f0f0f1 >> 0x20) & 0xfffffff0) + (int)(uVar29 / 0x11));
              fVar38 = (float)iVar23;
              if (iVar23 == 0) {
                uVar15 = (uint)fVar38 >> 0x10;
              }
              else {
                uVar10 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar38 >> 0x17) * 2);
                if (uVar10 == 0) {
                  uVar15 = half::convert((int)fVar38);
                }
                else {
                  uVar15 = (uint)uVar10 +
                           (((uint)fVar38 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar38 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              uVar29 = (ulong)((uint)fVar36 >> 0x10);
              if (iVar25 != 0) {
                uVar10 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                if (uVar10 == 0) {
                  uVar26 = half::convert((int)fVar36);
                  uVar29 = (ulong)uVar26;
                }
                else {
                  uVar29 = (ulong)((uint)uVar10 +
                                  (((uint)fVar36 & 0x7fffff) + 0xfff +
                                   (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd));
                }
              }
              uVar10 = (ushort)((uint)fVar37 >> 0x10);
              if (iVar16 != 0) {
                sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar37 >> 0x17) * 2);
                if (sVar3 == 0) {
                  uVar10 = half::convert((int)fVar37);
                }
                else {
                  uVar10 = sVar3 + (short)(((uint)fVar37 & 0x7fffff) + 0xfff +
                                           (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              local_68[uVar19] =
                   (Rgba)(local_178 & 0xffff |
                         (ulong)(uVar15 << 0x10) | (uVar29 & 0xffff) << 0x20 | (ulong)uVar10 << 0x30
                         );
              uVar19 = uVar19 + 1;
            } while (uVar19 != 400);
            uVar30 = uVar30 + 1;
            local_68 = local_68 + 400;
          } while (uVar30 != 300);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          remove(fileName._M_dataplus._M_p);
          out._vptr_RgbaOutputFile = (_func_int **)0x0;
          Imf_2_5::Header::Header
                    ((Header *)&__str,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
          pCVar20 = Imf_2_5::Header::compression((Header *)&__str);
          _Var8 = fileName._M_dataplus;
          *pCVar20 = ZIPS_COMPRESSION;
          iVar16 = Imf_2_5::globalThreadCount();
          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                    (&out,_Var8._M_p,(Header *)&__str,WRITE_RGBA,iVar16);
          Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,pRVar18,1,400);
          Imf_2_5::RgbaOutputFile::writePixels(&out,0x96);
          Imf_2_5::RgbaOutputFile::breakScanLine(&out,10,10,10,-1);
          Imf_2_5::RgbaOutputFile::breakScanLine(&out,0x19,10,10,-1);
          Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
          Imf_2_5::Header::~Header((Header *)&__str);
          base = (Rgba *)operator_new__(960000);
          local_170 = 0;
          local_168 = base;
          do {
            lVar33 = 0;
            do {
              uVar10 = uVar12;
              if (uVar12 == 0) {
                uVar10 = half::convert(-0x40800000);
              }
              uVar15 = (uint)uVar12;
              uVar14 = uVar12;
              uVar11 = uVar12;
              if (uVar12 == 0) {
                uVar15 = half::convert(-0x40800000);
                uVar11 = half::convert(-0x40800000);
                uVar14 = half::convert(-0x40800000);
              }
              local_168[lVar33] =
                   (Rgba)((ulong)uVar10 |
                         (ulong)(uVar15 << 0x10) | (ulong)uVar11 << 0x20 | (ulong)uVar14 << 0x30);
              lVar33 = lVar33 + 1;
            } while (lVar33 != 400);
            local_170 = local_170 + 1;
            local_168 = local_168 + 400;
          } while (local_170 != 300);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"reading one scan line at a time,",0x20);
          std::ostream::flush();
          _Var8 = fileName._M_dataplus;
          iVar16 = Imf_2_5::globalThreadCount();
          Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&__str,_Var8._M_p,iVar16);
          pBVar21 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&__str);
          iVar16 = (pBVar21->min).x;
          if ((pBVar21->max).x - iVar16 != 399) {
            __assert_fail("dw.max.x - dw.min.x + 1 == width",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x109,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          iVar25 = (pBVar21->min).y;
          if ((pBVar21->max).y - iVar25 != 299) {
            __assert_fail("dw.max.y - dw.min.y + 1 == height",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x10a,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          if (iVar16 != 0) {
            __assert_fail("dw.min.x == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x10b,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          if (iVar25 != 0) {
            __assert_fail("dw.min.y == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x10c,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          Imf_2_5::RgbaInputFile::setFrameBuffer((RgbaInputFile *)&__str,base,1,400);
          local_180 = 0;
          do {
            Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&__str,local_180);
            if ((local_180 == 0x19) || (local_180 == 10)) {
              __assert_fail("scanLineBroken",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                            ,0x123,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            if (0x95 < local_180) {
              __assert_fail("scanLinePresent == (y < height / 2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                            ,0x125,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            local_180 = local_180 + 1;
          } while (local_180 != 300);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          std::ostream::flush();
          phVar22 = &base->a;
          phVar24 = &pRVar18->a;
          uVar30 = 0;
          do {
            lVar33 = 0;
            do {
              if (((uVar30 < 0x96) && ((char)uVar30 != '\n')) && (((uint)uVar30 & 0xff) != 0x19)) {
                fVar36 = *(float *)((long)&half::_toFloat + (ulong)phVar22[lVar33 * 4 + -3]._h * 4);
                pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar24[lVar33 * 4 + -3]._h * 4);
                if (((((fVar36 != *pfVar1) || (NAN(fVar36) || NAN(*pfVar1))) ||
                     (fVar36 = *(float *)((long)&half::_toFloat +
                                         (ulong)phVar22[lVar33 * 4 + -2]._h * 4),
                     pfVar1 = (float *)((long)&half::_toFloat +
                                       (ulong)phVar24[lVar33 * 4 + -2]._h * 4), fVar36 != *pfVar1))
                    || ((NAN(fVar36) || NAN(*pfVar1) ||
                        (fVar36 = *(float *)((long)&half::_toFloat +
                                            (ulong)phVar22[lVar33 * 4 + -1]._h * 4),
                        pfVar1 = (float *)((long)&half::_toFloat +
                                          (ulong)phVar24[lVar33 * 4 + -1]._h * 4), fVar36 != *pfVar1
                        )))) ||
                   ((NAN(fVar36) || NAN(*pfVar1) ||
                    ((fVar36 = *(float *)((long)&half::_toFloat + (ulong)phVar22[lVar33 * 4]._h * 4)
                     , pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar24[lVar33 * 4]._h * 4)
                     , fVar36 != *pfVar1 || (NAN(fVar36) || NAN(*pfVar1))))))) {
                  __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                ,0x136,
                                "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                               );
                }
              }
              else {
                fVar36 = *(float *)((long)&half::_toFloat + (ulong)phVar22[lVar33 * 4 + -3]._h * 4);
                if (((((fVar36 != -1.0) || (NAN(fVar36))) ||
                     ((fVar36 = *(float *)((long)&half::_toFloat +
                                          (ulong)phVar22[lVar33 * 4 + -2]._h * 4), fVar36 != -1.0 ||
                      ((NAN(fVar36) ||
                       (fVar36 = *(float *)((long)&half::_toFloat +
                                           (ulong)phVar22[lVar33 * 4 + -1]._h * 4), fVar36 != -1.0))
                      )))) || (NAN(fVar36))) ||
                   ((fVar36 = *(float *)((long)&half::_toFloat + (ulong)phVar22[lVar33 * 4]._h * 4),
                    fVar36 != -1.0 || (NAN(fVar36))))) {
                  __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                ,0x13d,
                                "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                               );
                }
              }
              lVar33 = lVar33 + 1;
            } while (lVar33 != 400);
            uVar30 = uVar30 + 1;
            phVar22 = phVar22 + 0x640;
            phVar24 = phVar24 + 0x640;
          } while (uVar30 != 300);
          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&__str);
          operator_delete__(base);
          pRVar18 = (Rgba *)operator_new__(960000);
          local_170 = 0;
          local_168 = pRVar18;
          do {
            local_e8 = 0;
            do {
              uVar10 = uVar12;
              if (uVar12 == 0) {
                uVar10 = half::convert(-0x40800000);
              }
              uVar15 = (uint)uVar12;
              if (uVar12 == 0) {
                uVar15 = half::convert(-0x40800000);
              }
              uVar26 = (uint)uVar12;
              uVar11 = uVar12;
              if (uVar12 == 0) {
                uVar26 = half::convert(-0x40800000);
                uVar11 = half::convert(-0x40800000);
              }
              local_168[local_e8] =
                   (Rgba)((ulong)uVar10 |
                         (ulong)(uVar15 << 0x10) |
                         (ulong)(uVar26 & 0xffff) << 0x20 | (ulong)uVar11 << 0x30);
              local_e8 = local_e8 + 1;
            } while (local_e8 != 400);
            local_170 = local_170 + 1;
            local_168 = local_168 + 400;
          } while (local_170 != 300);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"reading multiple scan lines at a time,",0x26);
          std::ostream::flush();
          _Var8 = fileName._M_dataplus;
          iVar16 = Imf_2_5::globalThreadCount();
          Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&__str,_Var8._M_p,iVar16);
          pBVar21 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&__str);
          iVar16 = (pBVar21->min).x;
          if ((pBVar21->max).x - iVar16 == 399) {
            iVar25 = (pBVar21->min).y;
            if ((pBVar21->max).y - iVar25 != 299) {
              __assert_fail("dw.max.y - dw.min.y + 1 == height",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                            ,0x150,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            if (iVar16 == 0) {
              if (iVar25 == 0) {
                Imf_2_5::RgbaInputFile::setFrameBuffer((RgbaInputFile *)&__str,pRVar18,1,400);
                Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&__str,0,299);
                __assert_fail("scanLinesMissing || scanLinesBroken",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                              ,0x166,
                              "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                             );
              }
              __assert_fail("dw.min.y == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                            ,0x152,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            __assert_fail("dw.min.x == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x151,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          __assert_fail("dw.max.x - dw.min.x + 1 == width",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                        ,0x14f,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
    }
  }
  __assert_fail("x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                ,0x47,"void (anonymous namespace)::rgbaMethods()");
}

Assistant:

void
testRgba (const std::string &tempDir)
{
    try
    {
	cout << "Testing the RGBA image interface" << endl;

	rgbaMethods ();

	const int W = 237;
	const int H = 119;

	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
	    {
		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGBA,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGB,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_A,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   RgbaChannels (WRITE_R | WRITE_B),
				   LineOrder (lorder),
				   Compression (comp));
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}